

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

int __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref::copy
          (subtree_ref *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bt_impl_t *pbVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  leaf_reference __src;
  leaf_reference __dest;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_60;
  range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_48;
  
  (this->super_subtree_ref_base<false>)._rank = *(size_t *)(dst + 0x20);
  sVar5 = *(size_t *)(dst + 8);
  sVar3 = *(size_t *)(dst + 0x10);
  sVar4 = *(size_t *)(dst + 0x18);
  (this->super_subtree_ref_base<false>)._vector = *(bt_impl_t **)dst;
  (this->super_subtree_ref_base<false>)._index = sVar5;
  (this->super_subtree_ref_base<false>)._height = sVar3;
  (this->super_subtree_ref_base<false>)._size = sVar4;
  if (*(long *)(dst + 0x10) == 0) {
    sVar5 = alloc_leaf(*(bt_impl<4096UL,_(bv::allocation_policy_t)0> **)dst);
    (this->super_subtree_ref_base<false>)._index = sVar5;
    __src = subtree_ref_base<false>::leaf((subtree_ref_base<false> *)dst);
    __dest = subtree_ref_base<false>::leaf(&this->super_subtree_ref_base<false>);
    memcpy(__dest,__src,0x200);
  }
  else {
    sVar5 = alloc_node(*(bt_impl<4096UL,_(bv::allocation_policy_t)0> **)dst);
    (this->super_subtree_ref_base<false>)._index = sVar5;
    pbVar1 = (this->super_subtree_ref_base<false>)._vector;
    lVar2 = *(long *)(*(long *)dst + 0x20);
    local_48._v = (packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                   *)(*(long *)dst + 0x68);
    local_48._begin = *(long *)(dst + 8) * lVar2;
    local_48._end = lVar2 + local_48._begin;
    local_60._v = &pbVar1->sizes;
    local_60._begin = pbVar1->degree * sVar5;
    local_60._end = pbVar1->degree + local_60._begin;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(&local_60,&local_48);
    lVar2 = *(long *)(*(long *)dst + 0x20);
    local_48._v = (packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                   *)(*(long *)dst + 0xd0);
    local_60._v = &pbVar1->ranks;
    local_48._begin = *(long *)(dst + 8) * lVar2;
    local_48._end = lVar2 + local_48._begin;
    local_60._begin = sVar5 * pbVar1->degree;
    local_60._end = pbVar1->degree + local_60._begin;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(&local_60,&local_48);
    lVar2 = *(long *)(*(long *)dst + 0x20);
    local_48._v = (packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                   *)(*(long *)dst + 0x138);
    local_48._begin = (lVar2 + 1) * *(long *)(dst + 8);
    local_48._end = local_48._begin + 1 + lVar2;
    local_60._v = &pbVar1->pointers;
    local_60._begin = (pbVar1->degree + 1) * sVar5;
    local_60._end = local_60._begin + 1 + pbVar1->degree;
    range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=(&local_60,&local_48);
  }
  return (int)this;
}

Assistant:

subtree_ref copy() const
            {
                subtree_ref r = *this;
                if(is_node()) {
                    r._index = _vector.alloc_node();
                    
                    r.sizes()  = sizes();
                    r.ranks()    = ranks();
                    r.pointers() = pointers();
                } else {
                    r._index = _vector.alloc_leaf();
                    r.leaf() = leaf();
                }
                
                return r;
            }